

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O2

void LoadParameters(string *file_name)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> temp;
  FileStorage fs;
  VecReaderProxy<int,_1> r;
  long *local_188;
  undefined8 local_180;
  undefined1 local_178 [336];
  char local_28 [24];
  
  local_180 = 0;
  local_178[0] = 0;
  local_188 = (long *)local_178;
  cv::FileStorage::FileStorage(&fs,(string *)file_name,0,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  cVar1 = cv::FileStorage::isOpened();
  if (cVar1 != '\0') {
    cv::FileStorage::operator[]((char *)&temp);
    local_180 = 0;
    local_178[0] = 0;
    local_188 = (long *)local_178;
    cv::read((FileNode *)&temp,(string *)&cam_model_abi_cxx11_,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    cv::FileStorage::operator[](local_28);
    temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cv::FileNode::begin();
    r.it = (FileNodeIterator *)&local_188;
    cv::internal::VecReaderProxy<int,_1>::operator()(&r,&temp,0x7fffffff);
    iVar4 = 0;
    iVar5 = 0;
    if ((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == 8) {
      iVar4 = *temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar5 = temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[1];
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&temp.super__Vector_base<int,_std::allocator<int>_>);
    cv::FileStorage::operator[]((char *)&local_188);
    cv::operator>>((FileNode *)&local_188,(Mat *)Kl);
    cv::FileStorage::operator[]((char *)&local_188);
    cv::operator>>((FileNode *)&local_188,(Mat *)Dl);
    cv::FileStorage::operator[]((char *)&local_188);
    cv::operator>>((FileNode *)&local_188,(Mat *)xil);
    cv::Mat::eye((int)&local_188,3,3);
    (**(code **)(*local_188 + 0x18))(local_188,&local_188,Rl,0xffffffffffffffff);
    cv::MatExpr::~MatExpr((MatExpr *)&local_188);
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      cv::FileStorage::operator[]((char *)&local_188);
      cv::operator>>((FileNode *)&local_188,(Mat *)Rl);
      cv::FileStorage::operator[]((char *)&local_188);
      cv::operator>>((FileNode *)&local_188,(Mat *)Kr);
      cv::FileStorage::operator[]((char *)&local_188);
      cv::operator>>((FileNode *)&local_188,(Mat *)Dr);
      cv::FileStorage::operator[]((char *)&local_188);
      cv::operator>>((FileNode *)&local_188,(Mat *)xir);
      cv::FileStorage::operator[]((char *)&local_188);
      cv::operator>>((FileNode *)&local_188,(Mat *)Rr);
      cv::FileStorage::operator[]((char *)&local_188);
      cv::operator>>((FileNode *)&local_188,(Mat *)Translation);
    }
    cv::FileStorage::release();
    cap_cols = iVar4;
    cap_rows = iVar5;
    img_width = iVar4;
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      img_width = iVar4 / 2;
    }
    cv::FileStorage::~FileStorage(&fs);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Failed to open ini parameters");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

void LoadParameters(std::string file_name) {
  cv::FileStorage fs(file_name, cv::FileStorage::READ);
  if (!fs.isOpened()) {
    std::cout << "Failed to open ini parameters" << std::endl;
    exit(-1);
  }

  cv::Size cap_size;
  fs["cam_model"] >> cam_model;
  fs["cap_size" ] >> cap_size;
  fs["Kl"       ] >> Kl;
  fs["Dl"       ] >> Dl;
  fs["xil"      ] >> xil;
  Rl = cv::Mat::eye(3, 3, CV_64F);
  if (cam_model == "stereo") {
    fs["Rl"       ] >> Rl;
    fs["Kr"       ] >> Kr;
    fs["Dr"       ] >> Dr;
    fs["xir"      ] >> xir;
    fs["Rr"       ] >> Rr;
    fs["T"        ] >> Translation;
  }
  fs.release();

  img_width = cap_size.width;
  cap_cols  = cap_size.width;
  cap_rows  = cap_size.height;

  if (cam_model == "stereo")
    img_width  = cap_size.width / 2;
}